

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O1

RelationStats *
duckdb::RelationStatisticsHelper::ExtractProjectionStats
          (RelationStats *__return_storage_ptr__,LogicalProjection *proj,RelationStats *child_stats)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this;
  pointer *ppDVar1;
  pointer puVar2;
  pointer pDVar3;
  undefined8 uVar4;
  int iVar5;
  pointer pEVar6;
  type expr;
  DistinctCount *__args;
  iterator iVar7;
  pointer this_00;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ExpressionBinding res;
  DistinctCount local_90;
  RelationStats *local_80;
  RelationStats *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->cardinality = 1;
  __return_storage_ptr__->filter_strength = 1.0;
  __return_storage_ptr__->stats_initialized = false;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->cardinality = child_stats->cardinality;
  local_80 = __return_storage_ptr__;
  local_78 = child_stats;
  (*(proj->super_LogicalOperator)._vptr_LogicalOperator[3])(&local_70);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->table_name,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_00 = (proj->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (proj->super_LogicalOperator).expressions.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != puVar2) {
    this = &__return_storage_ptr__->column_names;
    do {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[7])(&local_70,pEVar6);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_70
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(this_00);
      GetChildColumnBinding((ExpressionBinding *)&local_70,expr);
      uVar4 = local_70.field_2._M_allocated_capacity;
      if (local_70.field_2._M_local_buf[8] == '\x01') {
        local_90.distinct_count = 1;
        local_90.from_hll = true;
        iVar7._M_current =
             (__return_storage_ptr__->column_distinct_count).
             super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->column_distinct_count).
            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
          _M_realloc_insert<duckdb::DistinctCount>
                    ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                     __return_storage_ptr__,iVar7,&local_90);
        }
        else {
          (iVar7._M_current)->distinct_count = 1;
          *(ulong *)&(iVar7._M_current)->from_hll = CONCAT44(local_90._12_4_,local_90._8_4_);
          ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
      }
      else {
        if ((ulong)local_70.field_2._0_8_ <
            (ulong)((long)(local_78->column_distinct_count).
                          super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                          .
                          super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_78->column_distinct_count).
                          super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                          .
                          super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          bVar8 = false;
          __return_storage_ptr__ = local_80;
        }
        else {
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_00);
          (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[8])(local_50,pEVar6);
          iVar5 = ::std::__cxx11::string::compare((char *)local_50);
          __return_storage_ptr__ = local_80;
          bVar8 = iVar5 == 0;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        }
        if (bVar8) {
          local_90.distinct_count = 1;
          local_90.from_hll = true;
          iVar7._M_current =
               (__return_storage_ptr__->column_distinct_count).
               super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (__return_storage_ptr__->column_distinct_count).
              super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
            _M_realloc_insert<duckdb::DistinctCount>
                      ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                       __return_storage_ptr__,iVar7,&local_90);
          }
          else {
LAB_00c81db2:
            uVar9 = (undefined4)local_90.distinct_count;
            uVar10 = local_90.distinct_count._4_4_;
            iVar5 = local_90._8_4_;
            uVar11 = local_90._12_4_;
LAB_00c81db7:
            *(undefined4 *)&(iVar7._M_current)->distinct_count = uVar9;
            *(undefined4 *)((long)&(iVar7._M_current)->distinct_count + 4) = uVar10;
            *(int *)&(iVar7._M_current)->from_hll = iVar5;
            *(undefined4 *)&(iVar7._M_current)->field_0xc = uVar11;
            ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                       super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                       super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppDVar1 = *ppDVar1 + 1;
          }
        }
        else {
          pDVar3 = (local_78->column_distinct_count).
                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar4 <
              (ulong)((long)(local_78->column_distinct_count).
                            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                            .
                            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 4)) {
            __args = pDVar3 + uVar4;
            iVar7._M_current =
                 (__return_storage_ptr__->column_distinct_count).
                 super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                 super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current !=
                (__return_storage_ptr__->column_distinct_count).
                super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              uVar9 = (undefined4)__args->distinct_count;
              uVar10 = *(undefined4 *)((long)&__args->distinct_count + 4);
              iVar5 = *(int *)&__args->from_hll;
              uVar11 = *(undefined4 *)&__args->field_0xc;
              goto LAB_00c81db7;
            }
            ::std::vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>>::
            _M_realloc_insert<duckdb::DistinctCount_const&>
                      ((vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>> *)
                       __return_storage_ptr__,iVar7,__args);
          }
          else {
            local_90.distinct_count = __return_storage_ptr__->cardinality;
            local_90._8_4_ = (uint)(uint3)local_90._9_3_ << 8;
            iVar7._M_current =
                 (__return_storage_ptr__->column_distinct_count).
                 super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                 super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current !=
                (__return_storage_ptr__->column_distinct_count).
                super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00c81db2;
            ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
            _M_realloc_insert<duckdb::DistinctCount>
                      ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                       __return_storage_ptr__,iVar7,&local_90);
          }
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
  }
  __return_storage_ptr__->stats_initialized = true;
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractProjectionStats(LogicalProjection &proj, RelationStats &child_stats) {
	auto proj_stats = RelationStats();
	proj_stats.cardinality = child_stats.cardinality;
	proj_stats.table_name = proj.GetName();
	for (auto &expr : proj.expressions) {
		proj_stats.column_names.push_back(expr->GetName());
		auto res = GetChildColumnBinding(*expr);
		D_ASSERT(res.found_expression);
		if (res.expression_is_constant) {
			proj_stats.column_distinct_count.push_back(DistinctCount({1, true}));
		} else {
			auto column_index = res.child_binding.column_index;
			if (column_index >= child_stats.column_distinct_count.size() && expr->ToString() == "count_star()") {
				// only one value for a count star
				proj_stats.column_distinct_count.push_back(DistinctCount({1, true}));
			} else {
				// TODO: add this back in
				//	D_ASSERT(column_index < stats.column_distinct_count.size());
				if (column_index < child_stats.column_distinct_count.size()) {
					proj_stats.column_distinct_count.push_back(child_stats.column_distinct_count.at(column_index));
				} else {
					proj_stats.column_distinct_count.push_back(DistinctCount({proj_stats.cardinality, false}));
				}
			}
		}
	}
	proj_stats.stats_initialized = true;
	return proj_stats;
}